

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

bool __thiscall restincurl::Worker::EvaluateState(Worker *this,bool transfersRunning,bool doDequeue)

{
  byte local_2a;
  byte local_29;
  lock_guard<std::mutex> local_20;
  lock_t lock;
  bool doDequeue_local;
  bool transfersRunning_local;
  Worker *this_local;
  
  lock._M_device._6_1_ = doDequeue;
  lock._M_device._7_1_ = transfersRunning;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  local_29 = 0;
  if ((this->abort_ & 1U) == 0) {
    local_2a = 1;
    if ((lock._M_device._7_1_ & 1) == 0) {
      local_2a = this->close_pending_ ^ 0xff;
    }
    local_29 = local_2a;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (bool)(local_29 & 1);
}

Assistant:

bool EvaluateState(const bool transfersRunning, const bool doDequeue) const noexcept {
            lock_t lock(mutex_);

            RESTINCURL_LOG_TRACE("Run loop: transfers_running=" << transfersRunning
                << ", do_dequeue=" << doDequeue
                << ", close_pending_=" << close_pending_);

            return !abort_ && (transfersRunning || !close_pending_);
        }